

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib.c
# Opt level: O1

void ndn_fib_remove_entry_if_empty(ndn_fib_t *self,ndn_fib_entry_t *entry)

{
  nametree_entry_t *pnVar1;
  
  if (((entry->nametree_id != 0xffff) && (entry->nexthop == 0)) &&
     (entry->on_interest == (ndn_on_interest_func)0x0)) {
    pnVar1 = ndn_nametree_at(self->nametree,entry->nametree_id);
    pnVar1->fib_id = 0xffff;
    entry->nametree_id = 0xffff;
    entry->nexthop = 0;
    entry->on_interest = (ndn_on_interest_func)0x0;
    entry->userdata = (void *)0x0;
  }
  return;
}

Assistant:

void
ndn_fib_remove_entry_if_empty(ndn_fib_t* self, ndn_fib_entry_t* entry)
{
  if(entry->nametree_id == NDN_INVALID_ID){
    return;
  }
  if(entry->nexthop == 0 && entry->on_interest == NULL){
    ndn_fib_remove_entry(self, entry);
  }
}